

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPG.cpp
# Opt level: O0

void __thiscall JPG::subsampling(JPG *this)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  MCU *pMVar5;
  Block *paiVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  Block **ppaiVar10;
  uint uVar11;
  double dVar12;
  uint sampledX;
  uint sampledY;
  uint x;
  uint y;
  Block *currentBlock;
  uint local_38;
  uint xOffset;
  uint jj;
  uint yOffSet;
  uint ii;
  uint componentID;
  uint widthOffset;
  uint heightOffset;
  MCU *currentMCU;
  uint j;
  uint i;
  JPG *this_local;
  
  for (currentMCU._4_4_ = 0; currentMCU._4_4_ < this->mcuHeight;
      currentMCU._4_4_ = currentMCU._4_4_ + 1) {
    for (currentMCU._0_4_ = 0; (uint)currentMCU < this->mcuWidth;
        currentMCU._0_4_ = (uint)currentMCU + 1) {
      pMVar5 = this->data;
      uVar4 = this->mcuWidth;
      bVar1 = this->maxVerticalSamplingFrequency;
      bVar2 = this->maxHorizontalSamplingFrequency;
      for (yOffSet = 1; yOffSet < 4; yOffSet = yOffSet + 1) {
        jj = 0;
        xOffset = currentMCU._4_4_ * bVar1 * 8;
        while( true ) {
          uVar7 = getVerticalSamplingFrequency(this,yOffSet);
          if (uVar7 <= jj) break;
          local_38 = 0;
          currentBlock._4_4_ = (uint)currentMCU * bVar2 * 8;
          while( true ) {
            uVar7 = getHorizontalSamplingFrequency(this,yOffSet);
            if (uVar7 <= local_38) break;
            ppaiVar10 = MCU::operator[](pMVar5 + (currentMCU._4_4_ * uVar4 + (uint)currentMCU),
                                        yOffSet);
            paiVar6 = *ppaiVar10;
            uVar7 = getHorizontalSamplingFrequency(this,yOffSet);
            uVar11 = jj * uVar7 + local_38;
            for (sampledY = 0; sampledY < 8; sampledY = sampledY + 1) {
              for (sampledX = 0; sampledX < 8; sampledX = sampledX + 1) {
                bVar3 = this->maxVerticalSamplingFrequency;
                uVar7 = getVerticalSamplingFrequency(this,yOffSet);
                uVar8 = xOffset + (sampledY * bVar3) / uVar7;
                bVar3 = this->maxHorizontalSamplingFrequency;
                uVar7 = getHorizontalSamplingFrequency(this,yOffSet);
                uVar9 = currentBlock._4_4_ + (sampledX * bVar3) / uVar7;
                if ((uVar9 < this->width) && (uVar8 < this->height)) {
                  dVar12 = YCbCr::operator[](this->BMPData + (uVar8 * this->width + uVar9),yOffSet);
                  paiVar6[uVar11][sampledY * 8 + sampledX] = (int)dVar12;
                }
                else {
                  paiVar6[uVar11][sampledY * 8 + sampledX] = 0;
                }
              }
            }
            local_38 = local_38 + 1;
            currentBlock._4_4_ = currentBlock._4_4_ + 8;
          }
          jj = jj + 1;
          xOffset = xOffset + 8;
        }
      }
    }
  }
  return;
}

Assistant:

void JPG::subsampling() {
    //遍历mcu
    for (uint i = 0; i < mcuHeight; i++) {
        for (uint j = 0; j < mcuWidth; j++) {
            MCU& currentMCU = data[i * mcuWidth + j];
            uint heightOffset = i * maxVerticalSamplingFrequency * 8;
            uint widthOffset = j * maxHorizontalSamplingFrequency * 8;
            //iterate over 每一个component Y, cb cr
            for (uint componentID = 1; componentID <= 3; componentID++) {
                //遍历block
                for(uint ii = 0, yOffSet = heightOffset; ii < getVerticalSamplingFrequency(componentID); ii++, yOffSet = yOffSet + 8) {
                    for(uint jj = 0, xOffset = widthOffset; jj < getHorizontalSamplingFrequency(componentID); jj++, xOffset = xOffset + 8) {
                        Block& currentBlock = currentMCU[componentID][ii * getHorizontalSamplingFrequency(componentID) + jj];
                        //遍历Block every pixels 像素
                        for(uint y = 0; y < 8; y++) {
                            for(uint x = 0; x < 8; x++) {
                                uint sampledY = yOffSet + y *  maxVerticalSamplingFrequency / getVerticalSamplingFrequency(componentID);
                                uint sampledX = xOffset + x * maxHorizontalSamplingFrequency / getHorizontalSamplingFrequency(componentID);
                                //cannot find in original pictures;
                                if(sampledX >= width || sampledY >= height) {
                                    currentBlock[y * 8 + x] = 0;
                                } else {
                                    currentBlock[y * 8 + x] = BMPData[sampledY * width + sampledX][componentID];
                                }
                            }
                        }
                    }
                }             
            }
        }
    }  
}